

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

Object * executeStatement(Object *__return_storage_ptr__,Statement s,Environment *env)

{
  ExpressionType EVar1;
  Expression *id;
  Expression *init;
  char *identifer;
  undefined8 uVar2;
  Call c;
  Object value;
  Object value_00;
  Object o_00;
  undefined4 line;
  undefined8 uVar3;
  int iVar4;
  Object *in_RAX;
  ulong uVar5;
  Object *extraout_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  Object *extraout_RAX_00;
  Object *extraout_RAX_01;
  Object *pOVar6;
  undefined8 uVar7;
  anon_union_8_4_50a03f35_for_Literal_2 aVar8;
  undefined8 uVar9;
  char *pcVar10;
  char *ide;
  long lVar11;
  ulong uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Literal LVar26;
  Literal LVar27;
  Block BVar28;
  Object o;
  Object o_1;
  Object o_2;
  undefined8 in_stack_fffffffffffffef8;
  Object local_f8;
  undefined4 local_b0;
  undefined4 uStack_ac;
  Literal LStack_a8;
  int iStack_98;
  undefined4 uStack_94;
  undefined4 local_90;
  undefined4 uStack_8c;
  int iStack_88;
  BlockType BStack_84;
  int local_80;
  BlockType BStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined4 local_70;
  undefined4 uStack_6c;
  Literal LStack_68;
  int iStack_58;
  undefined4 uStack_54;
  undefined4 local_50;
  undefined4 uStack_4c;
  int iStack_48;
  BlockType BStack_44;
  int local_40;
  BlockType BStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  line = s.field_1.blockStatement.numStatements;
  uVar2 = s.field_1.blockStatement.statements;
  uVar13 = s.field_1.breakStatement.pos.file;
  uVar3 = s.field_1.ifStatement.thenBranch.statements;
  uVar9 = s.field_1._32_8_;
  uVar7 = s.field_1.ifStatement.elseBranch.statements;
  if (STATEMENT_END < s.type) goto switchD_00104a4d_caseD_7;
  in_RAX = (Object *)&s;
  uVar5 = s.field_1._0_8_;
  switch(s.type) {
  case STATEMENT_SET:
    if (0 < s.field_1.printStatement.argCount) {
      lVar11 = 0;
      do {
        id = *(Expression **)((long)&((Statement *)uVar2)->type + lVar11);
        init = *(Expression **)((long)&((Statement *)uVar2)->field_1 + lVar11);
        EVar1 = id->type;
        if (EVar1 == EXPR_REFERENCE) {
          write_ref(id,init,env,env,line);
        }
        else if (EVar1 == EXPR_ARRAY) {
          write_array(id,init,env,env,line);
        }
        else {
          if (EVar1 != EXPR_VARIABLE) {
            pcVar10 = "\x1b[31m\n[Runtime Error] [Line:%d] Bad assignment target!\x1b[0m";
LAB_00105103:
            uVar5 = uVar5 & 0xffffffff;
            goto LAB_00105106;
          }
          pcVar10 = (id->field_1).variable.name;
          resolveExpression(&local_f8,init,env);
          value.field_1.instance = local_f8.field_1.instance;
          value.type = local_f8.type;
          value._4_4_ = local_f8._4_4_;
          value.field_1._8_4_ = local_f8.field_1.literal.field_2._0_4_;
          value.field_1._12_4_ = local_f8.field_1.literal.field_2._4_4_;
          value.field_1.routine.arity = (int)local_f8.field_1._16_8_;
          value.field_1._20_4_ = (int)((ulong)local_f8.field_1._16_8_ >> 0x20);
          value.field_1._24_4_ = (int)local_f8.field_1.routine.arguments;
          value.field_1._28_4_ = (int)((ulong)local_f8.field_1._24_8_ >> 0x20);
          value.field_1.container.constructor.numStatements = (int)local_f8.field_1._32_8_;
          value.field_1.container.constructor.blockName =
               (int)((ulong)local_f8.field_1._32_8_ >> 0x20);
          value.field_1.routine.code.numStatements =
               (int)local_f8.field_1.container.constructor.statements;
          value.field_1.routine.code.blockName = (int)((ulong)local_f8.field_1._40_8_ >> 0x20);
          value.field_1._48_4_ = (int)local_f8.field_1.routine.code.statements;
          value.field_1._52_4_ = (int)((ulong)local_f8.field_1._48_8_ >> 0x20);
          env_put(pcVar10,line,value,env);
        }
        lVar11 = lVar11 + 0x10;
      } while ((uVar5 >> 0x20) * 0x10 != lVar11);
    }
    goto LAB_00104e69;
  case STATEMENT_ARRAY:
    if (0 < s.field_1.printStatement.argCount) {
      uVar12 = 0;
      do {
        lVar11 = *(long *)(&((Statement *)uVar2)->type + uVar12 * 2);
        LVar27 = resolveLiteral(*(Expression **)(lVar11 + 0x10),line,env);
        if ((LVar27._0_8_ & 0xffffffff00000000) != 0x100000000) {
          pcVar10 = "\x1b[31m\n[Runtime Error] [Line:%d] Array dimension must be an integer!\x1b[0m"
          ;
          goto LAB_00105103;
        }
        env_arr_new(*(char **)(lVar11 + 0x18),line,LVar27.field_2.iVal,env);
        uVar12 = uVar12 + 1;
      } while (uVar5 >> 0x20 != uVar12);
    }
    goto LAB_00104e69;
  case STATEMENT_INPUT:
    if (0 < s.field_1.printStatement.argCount) {
      lVar11 = 0;
      do {
        iVar4 = *(int *)((long)&((Statement *)uVar2)->type + lVar11);
        pcVar10 = *(char **)((long)&((Statement *)uVar2)->field_1 + lVar11);
        if (iVar4 == 1) {
          identifer = *(char **)((long)&((Statement *)uVar2)->field_1 + lVar11 + 8);
          iVar4 = (int)pcVar10;
          if (iVar4 == 2) {
            LStack_68 = getFloat(line);
            local_70 = 1;
            uVar12 = CONCAT44(uStack_6c,1);
            uVar14 = LStack_68.field_2._0_4_;
            uVar15 = LStack_68.field_2._4_4_;
            uVar16 = iStack_58;
            uVar17 = uStack_54;
            uVar18 = local_50;
            uVar19 = uStack_4c;
            uVar20 = iStack_48;
            uVar21 = BStack_44;
            uVar22 = local_40;
            uVar23 = BStack_3c;
            uVar24 = uStack_38;
            uVar25 = uStack_34;
            uVar13 = LStack_68._0_8_;
          }
          else if (iVar4 == 1) {
            LStack_a8 = getInt(line);
            local_b0 = 1;
            uVar12 = CONCAT44(uStack_ac,1);
            uVar14 = LStack_a8.field_2._0_4_;
            uVar15 = LStack_a8.field_2._4_4_;
            uVar16 = iStack_98;
            uVar17 = uStack_94;
            uVar18 = local_90;
            uVar19 = uStack_8c;
            uVar20 = iStack_88;
            uVar21 = BStack_84;
            uVar22 = local_80;
            uVar23 = BStack_7c;
            uVar24 = uStack_78;
            uVar25 = uStack_74;
            uVar13 = LStack_a8._0_8_;
          }
          else {
            if (iVar4 != 0) goto LAB_00104df6;
            local_f8.field_1.literal = getString(line);
            local_f8.type = 1;
            uVar14 = local_f8.field_1._8_4_;
            uVar15 = local_f8.field_1._12_4_;
            uVar16 = local_f8.field_1.routine.arity;
            uVar17 = local_f8.field_1._20_4_;
            uVar18 = local_f8.field_1._24_4_;
            uVar19 = local_f8.field_1._28_4_;
            uVar20 = local_f8.field_1.container.constructor.numStatements;
            uVar21 = local_f8.field_1.container.constructor.blockName;
            uVar22 = local_f8.field_1.routine.code.numStatements;
            uVar23 = local_f8.field_1.routine.code.blockName;
            uVar24 = local_f8.field_1._48_4_;
            uVar25 = local_f8.field_1._52_4_;
            uVar12 = local_f8._0_8_;
            uVar13 = local_f8.field_1.instance;
          }
          value_00.field_1.instance = (Instance *)uVar13;
          value_00._0_8_ = uVar12;
          value_00.field_1._8_4_ = uVar14;
          value_00.field_1._12_4_ = uVar15;
          value_00.field_1.routine.arity = uVar16;
          value_00.field_1._20_4_ = uVar17;
          value_00.field_1._24_4_ = uVar18;
          value_00.field_1._28_4_ = uVar19;
          value_00.field_1.container.constructor.numStatements = uVar20;
          value_00.field_1.container.constructor.blockName = uVar21;
          value_00.field_1.routine.code.numStatements = uVar22;
          value_00.field_1.routine.code.blockName = uVar23;
          value_00.field_1._48_4_ = uVar24;
          value_00.field_1._52_4_ = uVar25;
          env_put(identifer,line,value_00,env);
        }
        else if (iVar4 == 0) {
          printString(pcVar10);
        }
LAB_00104df6:
        lVar11 = lVar11 + 0x18;
      } while ((uVar5 >> 0x20) * 0x18 != lVar11);
    }
LAB_00104e69:
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
    __return_storage_ptr__->type = OBJECT_NULL;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
    return __return_storage_ptr__;
  case STATEMENT_IF:
    LVar27 = resolveLiteral(s.field_1.ifStatement.condition,s.field_1.blockStatement.numStatements,
                            env);
    if (LVar27.type == LIT_LOGICAL) {
      if (LVar27.field_2._0_4_ != 0) {
        uVar7 = uVar3;
        uVar9 = uVar13;
      }
      BVar28.statements = (Statement *)uVar7;
      BVar28._0_8_ = uVar9;
      pOVar6 = executeBlock(__return_storage_ptr__,BVar28,env);
      return pOVar6;
    }
    goto LAB_00105128;
  case STATEMENT_WHILE:
    BVar28 = s.field_1._16_16_;
    LVar26 = resolveLiteral(s.field_1.ifStatement.condition,s.field_1.blockStatement.numStatements,
                            env);
    uVar5 = LVar26._0_8_ >> 0x20;
    LVar27.field_2.iVal = LVar26.field_2.iVal;
    LVar27.line = (int)uVar5;
    LVar27.type = (int)(uVar5 >> 0x20);
    if (LVar26.type == LIT_LOGICAL) {
      local_f8.field_1.container.constructor.statements = (Statement *)0;
      local_f8.field_1.routine.code.statements = (Statement *)0;
      local_f8.field_1.routine.arguments = (char **)0;
      local_f8.field_1._32_8_ = 0;
      local_f8.field_1._16_8_ = 0;
      local_f8.type = OBJECT_NULL;
      local_f8._4_4_ = 0;
      local_f8.field_1.literal = (Literal)ZEXT816((ulong)0x400000000);
      while (in_RAX = LVar27._0_8_, LVar27.field_2._0_4_ != 0) {
        in_RAX = executeBlock(&local_f8,BVar28,env);
        if (brk == '\x01') {
          brk = '\0';
          break;
        }
        if (ret == '\x01') {
          *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x28) =
               local_f8.field_1.container.constructor.statements;
          *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x30) =
               local_f8.field_1.routine.code.statements;
          (__return_storage_ptr__->field_1).routine.arguments = local_f8.field_1.routine.arguments;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_f8.field_1._32_8_;
          (__return_storage_ptr__->field_1).literal.field_2.iVal =
               (long)local_f8.field_1.literal.field_2;
          *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_f8.field_1._16_8_;
          goto LAB_0010508f;
        }
        LVar27 = resolveLiteral((Expression *)uVar2,line,env);
      }
      break;
    }
LAB_00105128:
    pcVar10 = "\x1b[31m\n[Runtime Error] [Line:%d] Not a logical expression as condition!\x1b[0m";
LAB_0010513f:
    uVar5 = (ulong)(uint)line;
LAB_00105106:
    printf(pcVar10,uVar5);
    putchar(10);
    unload_all();
    exit(1);
  case STATEMENT_BREAK:
    brk = '\x01';
    break;
  case STATEMENT_PRINT:
    if (0 < s.field_1.printStatement.argCount) {
      uVar12 = 0;
      do {
        in_RAX = resolveExpression(&local_f8,
                                   *(Expression **)(&((Statement *)uVar2)->type + uVar12 * 2),env);
        aVar8 = local_f8.field_1.literal.field_2;
        switch(local_f8._0_8_ & 0xffffffff) {
        case 0:
          iVar4 = printf("Null",local_f8.field_1.arr.values);
          in_RAX = (Object *)CONCAT44(extraout_var,iVar4);
          break;
        case 1:
          in_RAX = (Object *)((ulong)local_f8.field_1.instance >> 0x20);
          if (local_f8.field_1.literal.type < (LIT_NULL|LIT_INT)) {
            pOVar6 = (Object *)
                     (*(code *)(&DAT_00108c50 + *(int *)(&DAT_00108c50 + (long)in_RAX * 4)))();
            return pOVar6;
          }
          break;
        case 2:
          iVar4 = printf("<array of %d>",(ulong)local_f8.field_1.instance & 0xffffffff);
          in_RAX = (Object *)CONCAT44(extraout_var_00,iVar4);
          break;
        case 3:
          pcVar10 = "<routine %s>";
          goto LAB_00104f68;
        case 4:
          pcVar10 = "<container %s>";
          goto LAB_00104f68;
        case 5:
          pcVar10 = "<instance of container %s>";
          aVar8.sVal = (local_f8.field_1.instance)->name;
LAB_00104f68:
          iVar4 = printf(pcVar10,aVar8.iVal);
          in_RAX = (Object *)CONCAT44(extraout_var_01,iVar4);
        }
        uVar12 = uVar12 + 1;
      } while (uVar5 >> 0x20 != uVar12);
    }
    break;
  case STATEMENT_ROUTINE:
    env_routine_put(s.field_1.routine,s.field_1.blockStatement.numStatements,globalEnv);
    in_RAX = extraout_RAX_01;
    break;
  case STATEMENT_CALL:
    if ((s.field_1.blockStatement.statements)->type == STATEMENT_BREAK) {
      uVar2 = *(undefined8 *)((long)&(s.field_1.blockStatement.statements)->field_1 + 0x18);
      c._20_4_ = (int)((ulong)*(undefined8 *)
                               ((long)&(s.field_1.blockStatement.statements)->field_1 + 0x10) >>
                      0x20);
      c._0_20_ = *(undefined1 (*) [20])&(s.field_1.blockStatement.statements)->field_1;
      c.arguments._0_4_ = (int)uVar2;
      c.arguments._4_4_ = (int)((ulong)uVar2 >> 0x20);
      in_RAX = resolveCall(&local_f8,c,env);
      if (local_f8.type != OBJECT_NULL) {
        iVar4 = printf("\x1b[33m\n[Warning] [Line %d] Ignoring return value!\x1b[0m",
                       (ulong)(uint)line);
        in_RAX = (Object *)CONCAT44(extraout_var_02,iVar4);
        if (local_f8.type == OBJECT_INSTANCE) {
          o_00.field_1._8_4_ = (int)local_f8.field_1._16_8_;
          o_00._0_16_ = local_f8.field_1.literal;
          o_00.field_1._12_4_ = (int)((ulong)local_f8.field_1._16_8_ >> 0x20);
          o_00.field_1.routine.arity = (int)local_f8.field_1.routine.arguments;
          o_00.field_1._20_4_ = (int)((ulong)local_f8.field_1._24_8_ >> 0x20);
          o_00.field_1._24_4_ = (int)local_f8.field_1._32_8_;
          o_00.field_1._28_4_ = (int)((ulong)local_f8.field_1._32_8_ >> 0x20);
          o_00.field_1.container.constructor.numStatements =
               (int)local_f8.field_1.container.constructor.statements;
          o_00.field_1.container.constructor.blockName =
               (int)((ulong)local_f8.field_1._40_8_ >> 0x20);
          o_00.field_1.routine.code.numStatements = (int)local_f8.field_1.routine.code.statements;
          o_00.field_1.routine.code.blockName = (int)((ulong)local_f8.field_1._48_8_ >> 0x20);
          o_00.field_1.routine.code.statements = (Statement *)in_stack_fffffffffffffef8;
          gc_obj(o_00);
          in_RAX = extraout_RAX_00;
        }
      }
      break;
    }
    pcVar10 = "\x1b[31m\n[Runtime Error] [Line:%d] Expected call expression!\x1b[0m";
    goto LAB_0010513f;
  case STATEMENT_RETURN:
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
    (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
    __return_storage_ptr__->type = OBJECT_NULL;
    *(undefined4 *)&__return_storage_ptr__->field_0x4 = 0;
    (__return_storage_ptr__->field_1).instance = (Instance *)0x400000000;
    if (s.field_1.blockStatement.statements != (Statement *)0x0) {
      in_RAX = resolveExpression(&local_f8,s.field_1.ifStatement.condition,env);
      *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x28) =
           local_f8.field_1.container.constructor.statements;
      *(Statement **)((long)&__return_storage_ptr__->field_1 + 0x30) =
           local_f8.field_1.routine.code.statements;
      *(char ***)((long)&__return_storage_ptr__->field_1 + 0x18) =
           local_f8.field_1.routine.arguments;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = local_f8.field_1._32_8_;
      (__return_storage_ptr__->field_1).literal.field_2.iVal =
           (long)local_f8.field_1.literal.field_2;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = local_f8.field_1._16_8_;
      __return_storage_ptr__->type = local_f8.type;
      *(undefined4 *)&__return_storage_ptr__->field_0x4 = local_f8._4_4_;
      (__return_storage_ptr__->field_1).instance = local_f8.field_1.instance;
      if (__return_storage_ptr__->type == OBJECT_INSTANCE) {
        in_RAX = (Object *)(__return_storage_ptr__->field_1).instance;
        *(undefined4 *)((long)&in_RAX->field_1 + 8) = 1;
      }
    }
    ret = 1;
    return in_RAX;
  case STATEMENT_CONTAINER:
    env_container_put(s.field_1._0_48_,s.field_1.blockStatement.numStatements,globalEnv);
    in_RAX = extraout_RAX;
    break;
  case STATEMENT_END:
    exit(0);
  }
switchD_00104a4d_caseD_7:
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = 0;
  (__return_storage_ptr__->field_1).routine.arguments = (char **)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
  (__return_storage_ptr__->field_1).literal.field_2 = (anon_union_8_4_50a03f35_for_Literal_2)0;
  *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x10) = 0;
  local_f8.type = OBJECT_NULL;
  local_f8._4_4_ = 0;
  local_f8.field_1.instance = (Instance *)0x400000000;
LAB_0010508f:
  __return_storage_ptr__->type = local_f8.type;
  *(int *)&__return_storage_ptr__->field_0x4 = local_f8._4_4_;
  (__return_storage_ptr__->field_1).instance = local_f8.field_1.instance;
  return in_RAX;
}

Assistant:

static Object executeStatement(Statement s, Environment *env){
    switch(s.type){
        case STATEMENT_PRINT:
            return executePrint(s.printStatement, env);
        case STATEMENT_IF:
            return executeIf(s.ifStatement, env);
        case STATEMENT_WHILE:
            return executeWhile(s.whileStatement, env);
        case STATEMENT_SET:
            return executeSet(s.setStatement, env);
        case STATEMENT_ARRAY:
            return executeArray(s.arrayStatement, env);
        case STATEMENT_INPUT:
            return executeInput(s.inputStatement, env);
        case STATEMENT_BREAK:
            return executeBreak();
        case STATEMENT_END:
            return executeEnd();
        case STATEMENT_BEGIN:
            return executeBegin();
            //       case STATEMENT_DO:
            //           executeDo(s.)
        case STATEMENT_ROUTINE:
            return registerRoutine(s.routine);
        case STATEMENT_CONTAINER:
            return registerContainer(s.container);
        case STATEMENT_CALL:
            return executeCall(s.callStatement, env);
        case STATEMENT_NOOP:
            break;
        case STATEMENT_RETURN:
            return executeReturn(s.returnStatement, env);
        default:
            break;
    }
    return nullObject;
}